

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  cmState *this_00;
  pointer pbVar5;
  long lVar6;
  allocator local_139;
  string local_138;
  string local_118;
  string local_f8 [32];
  long local_d8;
  size_type eq;
  char *c;
  string def;
  char *itemSeparator;
  const_iterator defineEnd;
  const_iterator defineIt;
  char *df;
  undefined1 local_80 [8];
  string defineFlagVar;
  allocator local_49;
  string local_48 [8];
  string dflag;
  string *lang_local;
  string *definesString_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *defines_local;
  cmLocalGenerator *this_local;
  
  dflag.field_2._8_8_ = lang;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"-D",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,"CMAKE_",(allocator *)((long)&df + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&df + 7));
    std::__cxx11::string::operator+=((string *)local_80,(string *)dflag.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_80,"_DEFINE_FLAG");
    pcVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)local_80);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=(local_48,pcVar4);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  defineEnd._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(defines);
  itemSeparator =
       (char *)std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(defines);
  bVar1 = std::__cxx11::string::empty();
  def.field_2._8_8_ = " ";
  if ((bVar1 & 1) != 0) {
    def.field_2._8_8_ = "";
  }
  while (bVar2 = std::operator!=(&defineEnd,(_Self *)&itemSeparator), bVar2) {
    std::__cxx11::string::string((string *)&c,local_48);
    this_00 = GetState(this);
    bVar2 = cmState::UseWatcomWMake(this_00);
    if (bVar2) {
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->(&defineEnd);
      for (eq = std::__cxx11::string::c_str(); *(char *)eq != '\0'; eq = eq + 1) {
        if ((*(char *)eq == '$') || (*(char *)eq == '#')) {
          std::__cxx11::string::operator+=((string *)&c,'$');
        }
        std::__cxx11::string::operator+=((string *)&c,*(char *)eq);
      }
    }
    else {
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->(&defineEnd);
      local_d8 = std::__cxx11::string::find((char *)pbVar5,0xa55100);
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator->(&defineEnd);
      std::__cxx11::string::substr((ulong)local_f8,(ulong)pbVar5);
      std::__cxx11::string::operator+=((string *)&c,local_f8);
      std::__cxx11::string::~string(local_f8);
      if (local_d8 != -1) {
        std::__cxx11::string::operator+=((string *)&c,"=");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator->(&defineEnd);
        lVar6 = std::__cxx11::string::c_str();
        pcVar4 = (char *)(lVar6 + 1 + local_d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,pcVar4,&local_139);
        cmOutputConverter::EscapeForShell
                  (&local_118,&this->super_cmOutputConverter,&local_138,true,false,false);
        std::__cxx11::string::operator+=((string *)&c,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
      }
    }
    std::__cxx11::string::operator+=((string *)definesString,(char *)def.field_2._8_8_);
    def.field_2._8_8_ = (long)"\'\nfailed with:\n " + 0xf;
    std::__cxx11::string::operator+=((string *)definesString,(string *)&c);
    std::__cxx11::string::~string((string *)&c);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&defineEnd);
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }

  std::set<std::string>::const_iterator defineIt = defines.begin();
  const std::set<std::string>::const_iterator defineEnd = defines.end();
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (; defineIt != defineEnd; ++defineIt) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = defineIt->c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = defineIt->find("=");
      def += defineIt->substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(defineIt->c_str() + eq + 1, true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}